

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_and(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  _Bool _Var1;
  roaring_array_t *r;
  container_t *pcVar2;
  container_t *c2_00;
  _Bool local_5d;
  uint32_t local_5c;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint8_t type2;
  int iStack_38;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  uint32_t neededcap;
  int length2;
  int length1;
  uint8_t result_type;
  roaring_bitmap_t *x2_local;
  roaring_bitmap_t *x1_local;
  
  length2._3_1_ = '\0';
  neededcap = (x1->high_low_container).size;
  answer._4_4_ = (x2->high_low_container).size;
  local_5c = neededcap;
  if ((int)answer._4_4_ < (int)neededcap) {
    local_5c = answer._4_4_;
  }
  answer._0_4_ = local_5c;
  _length1 = &x2->high_low_container;
  x2_local = x1;
  r = &roaring_bitmap_create_with_capacity(local_5c)->high_low_container;
  _pos2 = r;
  _Var1 = is_cow(x2_local);
  local_5d = false;
  if (_Var1) {
    local_5d = is_cow((roaring_bitmap_t *)_length1);
  }
  roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)r,local_5d);
  _s2 = 0;
  iStack_38 = 0;
  while (_s2 < (int)neededcap && iStack_38 < (int)answer._4_4_) {
    c1._6_2_ = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s2);
    c1._4_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_38);
    if (c1._6_2_ == c1._4_2_) {
      pcVar2 = ra_get_container_at_index
                         (&x2_local->high_low_container,(uint16_t)_s2,(uint8_t *)((long)&c1 + 3));
      c2_00 = ra_get_container_at_index(_length1,(uint16_t)iStack_38,(uint8_t *)((long)&c1 + 2));
      pcVar2 = container_and(pcVar2,c1._3_1_,c2_00,c1._2_1_,(uint8_t *)((long)&length2 + 3));
      _Var1 = container_nonzero_cardinality(pcVar2,length2._3_1_);
      if (_Var1) {
        ra_append(_pos2,c1._6_2_,pcVar2,length2._3_1_);
      }
      else {
        container_free(pcVar2,length2._3_1_);
      }
      _s2 = _s2 + 1;
      iStack_38 = iStack_38 + 1;
    }
    else if (c1._6_2_ < c1._4_2_) {
      _s2 = ra_advance_until(&x2_local->high_low_container,c1._4_2_,_s2);
    }
    else {
      iStack_38 = ra_advance_until(_length1,c1._6_2_,iStack_38);
    }
  }
  return (roaring_bitmap_t *)_pos2;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_and(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_and(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);  // otherwise: memory leak!
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}